

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

int __thiscall PeleLM::derive(PeleLM *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  int ncomp;
  DeriveRec *this_00;
  MultiFab *this_01;
  undefined4 in_XMM0_Da;
  string msg;
  undefined1 local_68 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_58;
  uchar *local_40;
  FabFactory<amrex::FArrayBox> local_38;
  
  this_00 = amrex::DeriveList::get((DeriveList *)&amrex::AmrLevel::derive_lst,(string *)key);
  if (this_00 == (DeriveRec *)0x0) {
    amrex::AmrLevel::derive((AmrLevel *)local_68,ctx,key,(size_t *)((ulong)keylen & 0xffffffff));
    (this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel = (_func_int **)local_68._0_8_;
    if ((_func_int **)local_68._0_8_ == (_func_int **)0x0) {
      local_68._0_8_ = &vStack_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"PeleLM::derive(): unknown variable: ","");
      std::__cxx11::string::_M_append(local_68,*(ulong *)key);
      amrex::Error_host((char *)local_68._0_8_);
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_68._0_8_ != &vStack_58) {
        operator_delete((void *)local_68._0_8_,
                        (ulong)((long)&((vStack_58.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + 1));
      }
    }
  }
  else {
    this_01 = (MultiFab *)operator_new(0x180);
    local_40 = key;
    ncomp = amrex::DeriveRec::numDerive(this_00);
    local_68._0_8_ = (_func_int **)0x1;
    local_68._8_8_ = (Arena *)0x0;
    vStack_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080b918;
    amrex::MultiFab::MultiFab
              (this_01,(BoxArray *)(ctx + 0xd8),(DistributionMapping *)(ctx + 0x140),ncomp,
               (int)keylen,(MFInfo *)local_68,&local_38);
    (this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel = (_func_int **)this_01;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_58);
    (**(code **)(*(long *)ctx + 0x100))(in_XMM0_Da,ctx,local_40,this_01,0);
  }
  return (int)this;
}

Assistant:

std::unique_ptr<MultiFab>
PeleLM::derive (const std::string& name,
                Real               time,
                int                ngrow)
{
  AMREX_ASSERT(ngrow >= 0);

  std::unique_ptr<MultiFab> mf;
  const DeriveRec* rec = derive_lst.get(name);
  if (rec)
  {
    mf.reset(new MultiFab(grids, dmap, rec->numDerive(), ngrow));
    int dcomp = 0;
    derive(name,time,*mf,dcomp);
  }
  else
  {
    mf = std::move(AmrLevel::derive(name,time,ngrow));
  }

  if (mf==nullptr) {
    std::string msg("PeleLM::derive(): unknown variable: ");
    msg += name;
    amrex::Error(msg.c_str());
  }
  return mf;
}